

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_method_close(lua_State *L)

{
  int iVar1;
  IOFileUD *local_18;
  IOFileUD *iof;
  lua_State *L_local;
  
  if (L->base < L->top) {
    local_18 = io_tofile(L);
  }
  else {
    local_18 = (IOFileUD *)(*(long *)((L->glref).ptr64 + 0x2d0) + 0x30);
    if (local_18->fp == (FILE *)0x0) {
      lj_err_caller(L,LJ_ERR_IOCLFL);
    }
  }
  iVar1 = io_file_close(L,local_18);
  return iVar1;
}

Assistant:

LJLIB_CF(io_method_close)
{
  IOFileUD *iof;
  if (L->base < L->top) {
    iof = io_tofile(L);
  } else {
    iof = IOSTDF_IOF(L, GCROOT_IO_OUTPUT);
    if (iof->fp == NULL)
      lj_err_caller(L, LJ_ERR_IOCLFL);
  }
  return io_file_close(L, iof);
}